

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O1

void google::protobuf::internal::WireFormatLite::WriteSFixed64
               (int field_number,int64_t value,CodedOutputStream *output)

{
  byte *pbVar1;
  ulong uVar2;
  uint uVar3;
  
  pbVar1 = output->cur_;
  if ((output->impl_).end_ <= pbVar1) {
    pbVar1 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,pbVar1);
  }
  uVar2 = (ulong)(field_number * 8 + 1);
  output->cur_ = pbVar1;
  if (0x7f < (uint)(field_number << 3)) {
    do {
      uVar3 = (uint)uVar2;
      *pbVar1 = (byte)uVar2 | 0x80;
      uVar2 = uVar2 >> 7;
      pbVar1 = pbVar1 + 1;
    } while (0x3fff < uVar3);
  }
  *pbVar1 = (byte)uVar2;
  pbVar1 = pbVar1 + 1;
  output->cur_ = pbVar1;
  if ((output->impl_).end_ <= pbVar1) {
    pbVar1 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,pbVar1);
  }
  output->cur_ = pbVar1;
  *(int64_t *)pbVar1 = value;
  output->cur_ = pbVar1 + 8;
  return;
}

Assistant:

void WireFormatLite::WriteSFixed64(int field_number, int64_t value,
                                   io::CodedOutputStream* output) {
  WriteTag(field_number, WIRETYPE_FIXED64, output);
  WriteSFixed64NoTag(value, output);
}